

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_common.c
# Opt level: O2

_Bool epoxy_is_desktop_gl(void)

{
  _Bool _Var1;
  EGLenum EVar2;
  int iVar3;
  GLubyte *__s2;
  
  _Var1 = epoxy_current_context_is_egl();
  if (_Var1) {
    EVar2 = epoxy_egl_get_current_gl_context_api();
    if (EVar2 == 0x30a2) {
      return true;
    }
    if (EVar2 == 0x30a0) {
      return false;
    }
  }
  _Var1 = true;
  if ((api.begin_count == 0) && (__s2 = (*epoxy_glGetString)(0x1f02), __s2 != (GLubyte *)0x0)) {
    iVar3 = strncmp("OpenGL ES",(char *)__s2,9);
    _Var1 = iVar3 != 0;
  }
  return _Var1;
}

Assistant:

EPOXY_IMPORTEXPORT bool
epoxy_is_desktop_gl(void)
{
    const char *es_prefix = "OpenGL ES";
    const char *version;

#if EPOXY_SUPPORT_EGL
    /* PowerVR's OpenGL ES implementation (and perhaps other) don't
     * comply with the standard, which states that
     * "glGetString(GL_VERSION)" should return a string starting with
     * "OpenGL ES". Therefore, to distinguish desktop OpenGL from
     * OpenGL ES, we must also check the context type through EGL (we
     * can do that as PowerVR is only usable through EGL).
     */
    if (epoxy_current_context_is_egl()) {
        switch (epoxy_egl_get_current_gl_context_api()) {
        case EGL_OPENGL_API:     return true;
        case EGL_OPENGL_ES_API:  return false;
        case EGL_NONE:
        default:  break;
        }
    }
#endif

    if (api.begin_count)
        return true;

    version = (const char *)glGetString(GL_VERSION);

    /* If we didn't get a version back, there are only two things that
     * could have happened: either malloc failure (which basically
     * doesn't exist), or we were called within a glBegin()/glEnd().
     * Assume the second, which only exists for desktop GL.
     */
    if (!version)
        return true;

    return strncmp(es_prefix, version, strlen(es_prefix));
}